

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_112f20f::HandleDifferentCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this;
  pointer __s;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  uint uVar6;
  pointer pbVar7;
  pointer pcVar8;
  int iVar9;
  ulong uVar10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view value;
  string local_88;
  cmExecutionStatus *local_68;
  pointer local_60;
  pointer local_58;
  string local_50;
  
  pbVar7 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_68 = status;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7) < 0x21) {
    pcVar8 = (char *)0x0;
    local_58 = (char *)0x0;
    local_60 = (pointer)0x0;
  }
  else {
    iVar9 = 1;
    uVar10 = 1;
    uVar6 = 2;
    local_60 = (pointer)0x0;
    local_58 = (pointer)0x0;
    pcVar8 = (pointer)0x0;
    do {
      iVar3 = std::__cxx11::string::compare((char *)(pbVar7 + uVar10));
      if (iVar3 == 0) {
        iVar9 = 2;
      }
      else {
        if (iVar9 == 3) {
          local_58 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar10]._M_dataplus._M_p;
        }
        else {
          if (iVar9 == 2) {
            pcVar8 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar10]._M_dataplus._M_p;
            iVar9 = 3;
            goto LAB_0035cea3;
          }
          if (iVar9 != 1) {
            pbVar7 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_88.field_2._8_8_ = pbVar7[uVar10]._M_dataplus._M_p;
            local_88.field_2._M_allocated_capacity = pbVar7[uVar10]._M_string_length;
            local_88._M_dataplus._M_p = (pointer)0x21;
            local_88._M_string_length = 0x78585c;
            views._M_len = 2;
            views._M_array = (iterator)&local_88;
            cmCatViews_abi_cxx11_(&local_50,views);
            std::__cxx11::string::_M_assign((string *)&local_68->Error);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p == &local_50.field_2) {
              return false;
            }
            goto LAB_0035d04d;
          }
          local_60 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar10]._M_dataplus._M_p;
        }
        iVar9 = 0;
      }
LAB_0035cea3:
      uVar10 = (ulong)uVar6;
      pbVar7 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar6 = uVar6 + 1;
    } while (uVar10 < (ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5)
            );
  }
  __s = local_58;
  if (local_60 == (pointer)0x0) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"DIFFERENT not given result variable name.","");
    std::__cxx11::string::_M_assign((string *)&local_68->Error);
  }
  else {
    if ((pcVar8 != (char *)0x0) && (local_58 != (char *)0x0)) {
      paVar1 = &local_88.field_2;
      local_88._M_dataplus._M_p = (pointer)paVar1;
      sVar4 = strlen(pcVar8);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,pcVar8,pcVar8 + sVar4);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      sVar4 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,__s + sVar4);
      bVar2 = cmsys::SystemTools::FilesDiffer(&local_88,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      pcVar8 = local_60;
      this = local_68->Makefile;
      local_88._M_dataplus._M_p = (pointer)paVar1;
      sVar4 = strlen(local_60);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,pcVar8,pcVar8 + sVar4);
      pcVar5 = "0";
      if (bVar2) {
        pcVar5 = "1";
      }
      value._M_str = pcVar5;
      value._M_len = 1;
      cmMakefile::AddDefinition(this,&local_88,value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      return true;
    }
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"DIFFERENT not given FILES option with two file names.","");
    std::__cxx11::string::_M_assign((string *)&local_68->Error);
  }
  local_50.field_2._M_allocated_capacity = local_88.field_2._M_allocated_capacity;
  local_50._M_dataplus._M_p = local_88._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
LAB_0035d04d:
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool HandleDifferentCommand(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  /*
    FILE(DIFFERENT <variable> FILES <lhs> <rhs>)
   */

  // Evaluate arguments.
  const char* file_lhs = nullptr;
  const char* file_rhs = nullptr;
  const char* var = nullptr;
  enum Doing
  {
    DoingNone,
    DoingVar,
    DoingFileLHS,
    DoingFileRHS
  };
  Doing doing = DoingVar;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "FILES") {
      doing = DoingFileLHS;
    } else if (doing == DoingVar) {
      var = args[i].c_str();
      doing = DoingNone;
    } else if (doing == DoingFileLHS) {
      file_lhs = args[i].c_str();
      doing = DoingFileRHS;
    } else if (doing == DoingFileRHS) {
      file_rhs = args[i].c_str();
      doing = DoingNone;
    } else {
      status.SetError(cmStrCat("DIFFERENT given unknown argument ", args[i]));
      return false;
    }
  }
  if (!var) {
    status.SetError("DIFFERENT not given result variable name.");
    return false;
  }
  if (!file_lhs || !file_rhs) {
    status.SetError("DIFFERENT not given FILES option with two file names.");
    return false;
  }

  // Compare the files.
  const char* result =
    cmSystemTools::FilesDiffer(file_lhs, file_rhs) ? "1" : "0";
  status.GetMakefile().AddDefinition(var, result);
  return true;
}